

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall
chrono::robosimian::RS_Sled::RS_Sled
          (RS_Sled *this,string *name,shared_ptr<chrono::ChMaterialSurface> *mat,ChSystem *system)

{
  shared_ptr<chrono::ChBodyAuxRef> *__r;
  undefined8 uVar1;
  ChFrame *pCVar2;
  undefined1 auVar3 [16];
  allocator local_169;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_168 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_158;
  string local_148;
  ChVector<double> local_128;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  ChVector<double> local_c8;
  undefined1 local_a8 [136];
  
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_158,
             &mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  RS_Part::RS_Part(&this->super_RS_Part,name,(shared_ptr<chrono::ChMaterialSurface> *)&local_158,
                   system);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
  (this->super_RS_Part)._vptr_RS_Part = (_func_int **)&PTR__RS_Part_0019f9f8;
  (this->super_RS_Part).field_0xec = 1;
  local_c8.m_data[0] = 0.0;
  local_c8.m_data[1] = 0.0;
  local_c8.m_data[2] = 0.146762;
  local_e8 = 0x3fa1d8a548238540;
  uStack_e0 = 0x3fb519ef954eb13e;
  local_d8 = 0x3fbb192ea52ef912;
  local_108 = 0x3edd5c31593e5fb7;
  uStack_100 = 0xbec0c6f7a0b5ed8d;
  local_f8 = 0;
  *(undefined4 *)
   ((this->super_RS_Part).m_body.
    super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x28) = 1;
  chrono::ChVariablesBodyOwnMass::SetBodyMass(2.768775);
  __r = &(this->super_RS_Part).m_body;
  pCVar2 = (ChFrame *)
           (__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_148._M_dataplus._M_p = &DAT_3ff0000000000000;
  local_148.field_2._8_8_ = 0;
  local_148._M_string_length = 0;
  local_148.field_2._M_allocated_capacity = 0;
  ChFrame<double>::ChFrame((ChFrame<double> *)local_a8,&local_c8,(ChQuaternion<double> *)&local_148)
  ;
  chrono::ChBodyAuxRef::SetFrame_COG_to_REF(pCVar2);
  chrono::ChBody::SetInertiaXX
            ((__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  chrono::ChBody::SetInertiaXY
            ((__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBodyAuxRef,void>
            (local_168,&__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::Add(system,local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160);
  local_128.m_data[2] = 0.0;
  local_128.m_data[0] = 0.0;
  local_128.m_data[1] = 0.0;
  std::__cxx11::string::string((string *)&local_148,"robosim_sled_coll",&local_169);
  MeshShape::MeshShape
            ((MeshShape *)local_a8,&local_128,(ChQuaternion<double> *)&QUNIT,&local_148,CONVEX_HULL)
  ;
  std::vector<chrono::robosimian::MeshShape,_std::allocator<chrono::robosimian::MeshShape>_>::
  emplace_back<chrono::robosimian::MeshShape>(&(this->super_RS_Part).m_meshes,(MeshShape *)local_a8)
  ;
  std::__cxx11::string::~string((string *)(local_a8 + 0x38));
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::assign((char *)&(this->super_RS_Part).m_mesh_name);
  auVar3._8_4_ = 0x3f333333;
  auVar3._0_8_ = 0x3f3333333f333333;
  auVar3._12_4_ = 0x3f333333;
  (this->super_RS_Part).m_offset.m_data[2] = 0.0;
  (this->super_RS_Part).m_offset.m_data[0] = 0.0;
  (this->super_RS_Part).m_offset.m_data[1] = 0.0;
  uVar1 = vmovlps_avx(auVar3);
  (this->super_RS_Part).m_color.R = (float)(int)uVar1;
  (this->super_RS_Part).m_color.G = (float)(int)((ulong)uVar1 >> 0x20);
  (this->super_RS_Part).m_color.B = 0.7;
  return;
}

Assistant:

RS_Sled::RS_Sled(const std::string& name, std::shared_ptr<ChMaterialSurface> mat, ChSystem* system)
    : RS_Part(name, mat, system), m_collide(true) {
    double mass = 2.768775;
    ChVector<> com(0.000000, 0.000000, 0.146762);
    ChVector<> inertia_xx(0.034856, 0.082427, 0.105853);
    ChVector<> inertia_xy(0.000007, -0.000002, 0);

    m_body->SetIdentifier(1);
    m_body->SetMass(mass);
    m_body->SetFrame_COG_to_REF(ChFrame<>(com, ChQuaternion<>(1, 0, 0, 0)));
    m_body->SetInertiaXX(inertia_xx);
    m_body->SetInertiaXY(inertia_xy);
    system->Add(m_body);

    m_meshes.push_back(MeshShape(ChVector<>(0, 0, 0), QUNIT, "robosim_sled_coll", MeshShape::Type::CONVEX_HULL));

    m_mesh_name = "robosim_sled";
    m_offset = ChVector<>(0, 0, 0);
    m_color = ChColor(0.7f, 0.7f, 0.7f);
}